

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringbuilder.h
# Opt level: O2

QString * operator+=(QString *a,QStringBuilder<QStringBuilder<const_QString_&,_QString>,_QString> *b
                    )

{
  Data *pDVar1;
  qsizetype qVar2;
  long asize;
  long lVar3;
  long in_FS_OFFSET;
  QChar *it;
  QChar *local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  lVar3 = (((b->a).a)->d).size + (a->d).size + (b->a).b.d.size + (b->b).d.size;
  QString::detach(a);
  qVar2 = QArrayDataPointer<char16_t>::freeSpaceAtEnd(&a->d);
  if (qVar2 < lVar3) {
    pDVar1 = (a->d).d;
    if (pDVar1 == (Data *)0x0) {
      asize = 0;
    }
    else {
      asize = (pDVar1->super_QArrayData).alloc * 2;
    }
    if (asize < lVar3) {
      asize = lVar3;
    }
    QString::reserve(a,asize);
  }
  local_28 = QString::data(a);
  local_28 = local_28 + (a->d).size;
  QConcatenable<QStringBuilder<QStringBuilder<const_QString_&,_QString>,_QString>_>::appendTo<QChar>
            (b,&local_28);
  QString::resize((longlong)a);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return a;
  }
  __stack_chk_fail();
}

Assistant:

QString &operator+=(QString &a, const QStringBuilder<A, B> &b)
{
    qsizetype len = a.size() + QConcatenable< QStringBuilder<A, B> >::size(b);
    a.detach(); // a detach() in a.data() could reset a.capacity() to a.size()
    if (len > a.data_ptr().freeSpaceAtEnd()) // capacity() was broken when prepend()-optimization landed
        a.reserve(qMax(len, 2 * a.capacity()));
    QChar *it = a.data() + a.size();
    QConcatenable< QStringBuilder<A, B> >::appendTo(b, it);
    // we need to resize after the appendTo for the case str+=foo+str
    a.resize(it - a.constData()); //may be smaller than len if there was conversion from utf8
    return a;
}